

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

size_t URL_PrintableCharSize(uchar charVal)

{
  size_t local_18;
  size_t size;
  uchar charVal_local;
  
  if ((((((((charVal == '\0') || (charVal == '!')) || (charVal == '(')) ||
         ((charVal == ')' || (charVal == '*')))) || ((charVal == '-' || (charVal == '.')))) ||
       ((0x2f < charVal && (charVal < 0x3a)))) || ((0x40 < charVal && (charVal < 0x5b)))) ||
     ((charVal == '_' || ((0x60 < charVal && (charVal < 0x7b)))))) {
    local_18 = 1;
  }
  else if (charVal < 0x80) {
    local_18 = 3;
  }
  else {
    local_18 = 6;
  }
  return local_18;
}

Assistant:

static size_t URL_PrintableCharSize(unsigned char charVal)
{
    size_t size;
    if (IS_PRINTABLE(charVal))
    {
        size = 1;
    }
    else
    {
        if (charVal < 0x80)
        {
            size = 3;
        }
        else
        {
            size = 6;
        }
    }
    return size;
}